

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O1

bitset<513UL> * __thiscall
jsoncons::decode_traits<std::bitset<513ul>,char,void>::
decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
          (bitset<513UL> *__return_storage_ptr__,decode_traits<std::bitset<513ul>,char,void> *this,
          basic_staj_cursor<char> *cursor,
          json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
          *decoder,error_code *ec)

{
  uint uVar1;
  error_category *peVar2;
  ser_error *this_00;
  long *plVar3;
  size_t sVar4;
  size_t sVar5;
  error_code ec_00;
  error_code ec_01;
  undefined4 local_38;
  undefined8 local_30;
  
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::reset((json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
           *)cursor);
  (**(code **)(*(long *)this + 0x30))(this,cursor,decoder);
  if (*(int *)&(decoder->super_basic_json_visitor<char>)._vptr_basic_json_visitor == 0) {
    if (*(char *)&cursor[0xf]._vptr_basic_staj_cursor != '\0') {
      json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
      ::get_result((json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                    *)&stack0xffffffffffffffb8);
      json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::bitset<513UL>,_void>
      ::as(__return_storage_ptr__,
           (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
           &stack0xffffffffffffffb8);
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 &stack0xffffffffffffffb8);
      return __return_storage_ptr__;
    }
    this_00 = (ser_error *)__cxa_allocate_exception(0x58);
    std::error_code::error_code<jsoncons::conv_errc,void>
              ((error_code *)&stack0xffffffffffffffc8,conversion_failed);
    plVar3 = (long *)(**(code **)(*(long *)this + 0x48))(this);
    sVar4 = (**(code **)(*plVar3 + 0x10))(plVar3);
    plVar3 = (long *)(**(code **)(*(long *)this + 0x48))(this);
    sVar5 = (**(code **)(*plVar3 + 0x18))(plVar3);
    ec_01._4_4_ = 0;
    ec_01._M_value = local_38;
    ec_01._M_cat = (error_category *)local_30;
    ser_error::ser_error(this_00,ec_01,sVar4,sVar5);
  }
  else {
    this_00 = (ser_error *)__cxa_allocate_exception(0x58);
    uVar1 = *(uint *)&(decoder->super_basic_json_visitor<char>)._vptr_basic_json_visitor;
    peVar2 = *(error_category **)&decoder->field_0x8;
    plVar3 = (long *)(**(code **)(*(long *)this + 0x48))(this);
    sVar4 = (**(code **)(*plVar3 + 0x10))(plVar3);
    plVar3 = (long *)(**(code **)(*(long *)this + 0x48))(this);
    sVar5 = (**(code **)(*plVar3 + 0x18))(plVar3);
    ec_00._4_4_ = 0;
    ec_00._M_value = uVar1;
    ec_00._M_cat = peVar2;
    ser_error::ser_error(this_00,ec_00,sVar4,sVar5);
  }
  __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

static T decode(basic_staj_cursor<CharT>& cursor, 
            json_decoder<Json,TempAllocator>& decoder, 
            std::error_code& ec)
        {
            decoder.reset();
            cursor.read_to(decoder, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec, cursor.context().line(), cursor.context().column()));
            }
            else if (!decoder.is_valid())
            {
                JSONCONS_THROW(ser_error(conv_errc::conversion_failed, cursor.context().line(), cursor.context().column()));
            }
            return decoder.get_result().template as<T>();
        }